

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<float>::
     call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,std::function<float(QString_const&)>,QString_const&>
               (QPromiseResolve<float> *resolve,QPromiseReject<float> *reject,
               function<float_(const_QString_&)> *fn,QString *args)

{
  float local_2c;
  QString *local_28;
  QString *args_local;
  function<float_(const_QString_&)> *fn_local;
  QPromiseReject<float> *reject_local;
  QPromiseResolve<float> *resolve_local;
  
  local_28 = args;
  args_local = (QString *)fn;
  fn_local = (function<float_(const_QString_&)> *)reject;
  reject_local = (QPromiseReject<float> *)resolve;
  local_2c = std::function<float_(const_QString_&)>::operator()(fn,args);
  PromiseFulfill<float>::
  call<float,QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
            (&local_2c,(QPromiseResolve<float> *)reject_local,(QPromiseReject<float> *)fn_local);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }